

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedSeparateCase::runComputeShader
          (ComputeShaderGeneratedSeparateCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  IVec3 *v;
  IVec3 commandDispatchSize;
  IVec3 dataBufferDispatchSize;
  string local_1d0 [36];
  IVec3 drawArraysDataBufferDispatchSize;
  undefined1 local_1a0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    commandDispatchSize.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
    commandDispatchSize.m_data._4_8_ = &DAT_100000001;
    iVar2 = commandDispatchSize.m_data[0] * (this->super_ComputeShaderGeneratedCase).m_commandSize;
    (**(code **)(lVar4 + 0x1680))((this->m_computeCmdProgram->m_program).m_program);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Binding command buffer to binding point ");
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_cmdBufferID);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Allocating memory for command buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_(0);
    std::operator<<((ostream *)poVar1,local_1d0);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x150))(0x90d2,(long)iVar2,0,0x88e8);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Dispatching command compute, size = ");
    tcu::operator<<((ostream *)poVar1,&commandDispatchSize);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x528))
              (commandDispatchSize.m_data[0],commandDispatchSize.m_data._4_8_ & 0xffffffff,
               commandDispatchSize.m_data[2]);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"calculate cmd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x71f);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    drawArraysDataBufferDispatchSize.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_gridSize
    ;
    commandDispatchSize.m_data[0] = drawArraysDataBufferDispatchSize.m_data[0] + 1;
    drawArraysDataBufferDispatchSize.m_data[2] = 1;
    commandDispatchSize.m_data[2] = 1;
    commandDispatchSize.m_data[1] = commandDispatchSize.m_data[0];
    v = &drawArraysDataBufferDispatchSize;
    if ((this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      v = &commandDispatchSize;
    }
    drawArraysDataBufferDispatchSize.m_data[1] = drawArraysDataBufferDispatchSize.m_data[0];
    tcu::Vector<int,_3>::Vector(&dataBufferDispatchSize,v);
    dVar3 = ComputeShaderGeneratedCase::calcDrawBufferSize(&this->super_ComputeShaderGeneratedCase);
    (**(code **)(lVar4 + 0x1680))((this->m_computeDataProgram->m_program).m_program);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Binding data buffer to binding point ");
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_dataBufferID);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Allocating memory for data buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_(0);
    std::operator<<((ostream *)poVar1,local_1d0);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x150))(0x90d2,(long)(int)(dVar3 << 4),0,0x88e8);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Dispatching data compute, size = ");
    tcu::operator<<((ostream *)poVar1,&dataBufferDispatchSize);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x528))
              (dataBufferDispatchSize.m_data[0],dataBufferDispatchSize.m_data[1],
               dataBufferDispatchSize.m_data[2]);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"calculate data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x73b);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) {
    commandDispatchSize.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    commandDispatchSize.m_data[2] = 1;
    commandDispatchSize.m_data[1] = commandDispatchSize.m_data[0];
    iVar2 = 0;
    if ((this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      iVar2 = commandDispatchSize.m_data[0] * commandDispatchSize.m_data[0] * 0x18;
    }
    (**(code **)(lVar4 + 0x1680))((this->m_computeIndicesProgram->m_program).m_program);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Binding index buffer to binding point ");
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_indexBufferID);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Allocating memory for index buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_(0);
    std::operator<<((ostream *)poVar1,local_1d0);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x150))(0x90d2,(long)iVar2,0,0x88e8);
    local_1a0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Dispatching index compute, size = ");
    tcu::operator<<((ostream *)poVar1,&commandDispatchSize);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar4 + 0x528))
              (commandDispatchSize.m_data[0],commandDispatchSize.m_data._4_8_ & 0xffffffff,
               commandDispatchSize.m_data[2]);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"calculate indices",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x757);
  }
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x75a);
  return;
}

Assistant:

void ComputeShaderGeneratedSeparateCase::runComputeShader (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Compute command

	if (m_computeCmd)
	{
		const int				bindingPoint			= 0;
		const tcu::IVec3		commandDispatchSize		(m_numDrawCmds, 1, 1);
		const int				bufferSize				= m_commandSize * m_numDrawCmds;

		gl.useProgram(m_computeCmdProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding command buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_cmdBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for command buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching command compute, size = " << commandDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(commandDispatchSize.x(), commandDispatchSize.y(), commandDispatchSize.z());

		glu::checkError(gl.getError(), "calculate cmd", __FILE__, __LINE__);
	}

	// Compute data

	if (m_computeData)
	{
		const int				bindingPoint						= 0;
		const tcu::IVec3		drawElementsDataBufferDispatchSize	(m_gridSize+1, m_gridSize+1, 1);
		const tcu::IVec3		drawArraysDataBufferDispatchSize	(m_gridSize,   m_gridSize,   1);
		const tcu::IVec3		dataBufferDispatchSize				= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS) ? (drawElementsDataBufferDispatchSize) : (drawArraysDataBufferDispatchSize);
		const int				bufferSize							= (int)(calcDrawBufferSize()*sizeof(tcu::Vec4));

		gl.useProgram(m_computeDataProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding data buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_dataBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for data buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching data compute, size = " << dataBufferDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(dataBufferDispatchSize.x(), dataBufferDispatchSize.y(), dataBufferDispatchSize.z());

		glu::checkError(gl.getError(), "calculate data", __FILE__, __LINE__);
	}

	// Compute indices

	if (m_computeIndices)
	{
		const int				bindingPoint				= 0;
		const tcu::IVec3		indexBufferDispatchSize		(m_gridSize, m_gridSize, 1);
		const int				bufferSize					= (int)(calcIndexBufferSize()*sizeof(deUint32));

		DE_ASSERT(m_drawMethod == DRAWMETHOD_DRAWELEMENTS);

		gl.useProgram(m_computeIndicesProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding index buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_indexBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for index buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching index compute, size = " << indexBufferDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(indexBufferDispatchSize.x(), indexBufferDispatchSize.y(), indexBufferDispatchSize.z());

		glu::checkError(gl.getError(), "calculate indices", __FILE__, __LINE__);
	}

	glu::checkError(gl.getError(), "post dispatch", __FILE__, __LINE__);
}